

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t parse_hex_nibble(char c)

{
  wchar_t wVar1;
  undefined3 in_register_00000039;
  
  if ((byte)(c - 0x30U) < 10) {
    return CONCAT31(in_register_00000039,c) + L'\xffffffd0';
  }
  wVar1 = L'\xffffffff';
  if ((byte)(c + 0x9fU) < 6) {
    wVar1 = CONCAT31(in_register_00000039,c) + L'\xffffffa9';
  }
  return wVar1;
}

Assistant:

static int
parse_hex_nibble(char c)
{
	if (c >= '0' && c <= '9')
		return c - '0';
	if (c >= 'a' && c <= 'f')
		return 10 + c - 'a';
#if 0
	/* XXX: Is uppercase something we should support? */
	if (c >= 'A' && c <= 'F')
		return 10 + c - 'A';
#endif

	return -1;
}